

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O3

bool fileMatch(string *file,Instruction *I)

{
  int iVar1;
  char *pcVar2;
  size_t __n;
  bool bVar3;
  undefined1 auVar4 [16];
  
  llvm::Instruction::getFunction();
  pcVar2 = (char *)llvm::Function::getSubprogram();
  if (*pcVar2 != '\x0f') {
    pcVar2 = *(char **)(pcVar2 + (ulong)*(uint *)(pcVar2 + 8) * -8);
  }
  if (*(long *)(pcVar2 + (ulong)*(uint *)(pcVar2 + 8) * -8) == 0) {
    bVar3 = file->_M_string_length == 0;
  }
  else {
    auVar4 = llvm::MDString::getString();
    __n = auVar4._8_8_;
    if (__n == file->_M_string_length) {
      if (__n == 0) {
        bVar3 = true;
      }
      else {
        iVar1 = bcmp(auVar4._0_8_,(file->_M_dataplus)._M_p,__n);
        bVar3 = iVar1 == 0;
      }
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

static bool fileMatch(const std::string &file, const llvm::Instruction &I) {
#if LLVM_VERSION_MAJOR == 3 && LLVM_VERSION_MINOR <= 7
    const auto *F = I.getParent()->getParent();
    const auto *subprog = llvm::cast<llvm::DISubprogram>(
            F->getMetadata(llvm::LLVMContext::MD_dbg));
#else
    const auto *subprog = I.getFunction()->getSubprogram();
#endif
    return subprog->getFile()->getFilename() == file;
}